

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_disconnect(connectdata *conn,_Bool dead_connection)

{
  CURLcode CVar1;
  imap_conn *imapc;
  _Bool dead_connection_local;
  connectdata *conn_local;
  
  if ((((!dead_connection) && ((conn->proto).ftpc.pp.conn != (connectdata *)0x0)) &&
      (((((conn->proto).ftpc.pp.conn)->bits).protoconnstart & 1U) != 0)) &&
     (CVar1 = imap_perform_logout(conn), CVar1 == CURLE_OK)) {
    imap_block_statemach(conn);
  }
  Curl_pp_disconnect(&(conn->proto).ftpc.pp);
  Curl_sasl_cleanup(conn,(conn->proto).imapc.authused);
  if ((conn->proto).ftpc.prevpath != (char *)0x0) {
    (*Curl_cfree)((conn->proto).ftpc.prevpath);
    (conn->proto).ftpc.prevpath = (char *)0x0;
  }
  if ((conn->proto).imapc.mailbox_uidvalidity != (char *)0x0) {
    (*Curl_cfree)((conn->proto).imapc.mailbox_uidvalidity);
    (conn->proto).imapc.mailbox_uidvalidity = (char *)0x0;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode imap_disconnect(struct connectdata *conn, bool dead_connection)
{
  struct imap_conn *imapc = &conn->proto.imapc;

  /* We cannot send quit unconditionally. If this connection is stale or
     bad in any way, sending quit and waiting around here will make the
     disconnect wait in vain and cause more problems than we need to. */

  /* The IMAP session may or may not have been allocated/setup at this
     point! */
  if(!dead_connection && imapc->pp.conn && imapc->pp.conn->bits.protoconnstart)
    if(!imap_perform_logout(conn))
      (void)imap_block_statemach(conn); /* ignore errors on LOGOUT */

  /* Disconnect from the server */
  Curl_pp_disconnect(&imapc->pp);

  /* Cleanup the SASL module */
  Curl_sasl_cleanup(conn, imapc->authused);

  /* Cleanup our connection based variables */
  Curl_safefree(imapc->mailbox);
  Curl_safefree(imapc->mailbox_uidvalidity);

  return CURLE_OK;
}